

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::printList(Graph *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  
  iVar2 = this->num_of_vert;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Successors",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (0 < (long)iVar2) {
    lVar4 = 0;
    do {
      lVar5 = lVar4 + 1;
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      if (0 < (int)((ulong)((long)this->adj_list[lVar4].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)this->adj_list[lVar4].super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 2)) {
        pvVar1 = this->adj_list + lVar4;
        lVar4 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-> ",3);
          std::ostream::operator<<
                    ((ostream *)&std::cout,
                     (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar4]);
          lVar4 = lVar4 + 1;
        } while (lVar4 < (int)((ulong)((long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>).
                                            _M_impl.super__Vector_impl_data._M_start) >> 2));
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      lVar4 = lVar5;
    } while (lVar5 != iVar2);
  }
  return;
}

Assistant:

void Graph::printList(){
   int nv = this->num_of_vert;
   cout << endl << "Successors" << endl;
   for(int i = 0; i < nv; i++){
      cout << i + 1 << ":";
      for(int j = 0; j < (int)adj_list[i].size(); j++)
         cout << "-> " << this->adj_list[i][j];
      cout << endl;
   }
   return void();
}